

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::EnumNextPrevMethod::EnumNextPrevMethod
          (EnumNextPrevMethod *this,KnownSystemName knownNameId,bool next)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005af720;
  this->next = next;
  return;
}

Assistant:

EnumNextPrevMethod(KnownSystemName knownNameId, bool next) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), next(next) {}